

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.cpp
# Opt level: O0

bool __thiscall crnlib::data_stream::read_line(data_stream *this,dynamic_string *str)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  bool prev_got_cr;
  int c;
  dynamic_string *str_local;
  data_stream *this_local;
  
  dynamic_string::empty(str);
  while( true ) {
    do {
      iVar3 = read_byte(this);
      bVar1 = this->field_0x1a;
      this->field_0x1a = this->field_0x1a & 0xfb;
      if (iVar3 < 0) {
        bVar2 = dynamic_string::is_empty(str);
        if (!bVar2) {
          return true;
        }
        return false;
      }
    } while ((iVar3 == 0x1a) || (iVar3 == 0));
    if (iVar3 == 0xd) break;
    if (iVar3 == 10) {
      if ((bVar1 >> 2 & 1) == 0) {
        return true;
      }
    }
    else {
      dynamic_string::append_char(str,(char)iVar3);
    }
  }
  this->field_0x1a = this->field_0x1a & 0xfb | 4;
  return true;
}

Assistant:

bool data_stream::read_line(dynamic_string& str) {
  str.empty();

  for (;;) {
    const int c = read_byte();

    const bool prev_got_cr = m_got_cr;
    m_got_cr = false;

    if (c < 0) {
      if (!str.is_empty())
        break;

      return false;
    } else if ((26 == c) || (!c))
      continue;
    else if (13 == c) {
      m_got_cr = true;
      break;
    } else if (10 == c) {
      if (prev_got_cr)
        continue;

      break;
    }

    str.append_char(static_cast<char>(c));
  }

  return true;
}